

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicFileSystem.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
Diligent::SplitPath<std::__cxx11::string>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Diligent *this,Char *Path,bool Simplify)

{
  Diligent DVar1;
  pointer pbVar2;
  pointer pcVar3;
  int iVar4;
  long lVar5;
  Diligent *pDVar6;
  size_type __n;
  Char *c;
  Char *CmpStart;
  Diligent *local_38;
  Diligent *local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar6 = this + 1;
  __n = 1;
  do {
    DVar1 = pDVar6[-1];
    if ((DVar1 == (Diligent)0x2f) || (DVar1 == (Diligent)0x5c)) {
      __n = __n + (*pDVar6 != (Diligent)0x5c && *pDVar6 != (Diligent)0x2f);
    }
    else if (DVar1 == (Diligent)0x0) break;
    pDVar6 = pDVar6 + 1;
  } while( true );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(__return_storage_ptr__,__n);
  if (*this != (Diligent)0x0) {
    local_38 = this;
    do {
      lVar5 = -(long)local_38;
      for (; (local_30 = local_38, DVar1 = *local_38, DVar1 == (Diligent)0x2f ||
             (DVar1 == (Diligent)0x5c)); local_38 = local_38 + 1) {
        lVar5 = lVar5 + -1;
      }
      if (DVar1 == (Diligent)0x0) {
        return __return_storage_ptr__;
      }
      pDVar6 = local_38 + lVar5;
      while( true ) {
        DVar1 = *local_38;
        if (((DVar1 == (Diligent)0x0) || (DVar1 == (Diligent)0x2f)) || (DVar1 == (Diligent)0x5c))
        break;
        pDVar6 = pDVar6 + 1;
        local_38 = local_38 + 1;
      }
      if ((char)Path == '\0') {
LAB_00306c74:
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*const&,char_const*&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,(char **)&local_30,(char **)&local_38);
      }
      else if (pDVar6 == (Diligent *)0x2) {
        if (((*local_30 != (Diligent)0x2e) ||
            ((local_30[1] != (Diligent)0x2e ||
             (pbVar2 = (__return_storage_ptr__->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish,
             (__return_storage_ptr__->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start == pbVar2)))) ||
           (iVar4 = std::__cxx11::string::compare((char *)(pbVar2 + -1)), iVar4 == 0))
        goto LAB_00306c74;
        pbVar2 = (__return_storage_ptr__->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        (__return_storage_ptr__->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = pbVar2 + -1;
        pcVar3 = pbVar2[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != &pbVar2[-1].field_2) {
          operator_delete(pcVar3,pbVar2[-1].field_2._M_allocated_capacity + 1);
        }
      }
      else if ((pDVar6 != (Diligent *)0x1) || (*local_30 != (Diligent)0x2e)) goto LAB_00306c74;
    } while (*local_38 != (Diligent)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<StringType> SplitPath(const Char* Path, bool Simplify)
{
    std::vector<StringType> Components;

    // BasicFileSystem::IsSlash() does not get inlined by at least MSVC
    auto IsSlash = [](Char c) {
        return c == '/' || c == '\\';
    };

    // Estimate the number of components and reserve space in the vector
    {
        size_t CompnentCount = 1;
        for (const auto* c = Path; *c != '\0'; ++c)
        {
            if (IsSlash(c[0]) && !IsSlash(c[1]))
                ++CompnentCount;
        }
        Components.reserve(CompnentCount);
    }

    const auto* c = Path;
    while (*c != '\0')
    {
        while (IsSlash(*c))
            ++c;

        if (*c == '\0')
        {
            // a/
            break;
        }

        const auto* const CmpStart = c;
        while (*c != '\0' && !IsSlash(*c))
            ++c;

        if (Simplify)
        {
            if ((c - CmpStart) == 1 && CmpStart[0] == '.') // "."
            {
                // Skip /.
                continue;
            }
            else if ((c - CmpStart) == 2 && CmpStart[0] == '.' && CmpStart[1] == '.') // ".."
            {
                // Pop previous subdirectory if "/.." is found, but only if there is
                // no ".." already (e.g "../..")
                if (!Components.empty() && Components.back() != "..")
                {
                    Components.pop_back();
                    continue;
                }
            }
        }

        Components.emplace_back(CmpStart, c);
    }

    return Components;
}